

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O2

MPI_Comm GA_MPI_Comm_pgroup(int p_grp)

{
  undefined8 in_RAX;
  MPI_Comm poVar1;
  ARMCI_Group group;
  undefined8 uStack_8;
  
  if (p_grp < 1) {
    uStack_8 = in_RAX;
    ARMCI_Group_get_world((ARMCI_Group *)((long)&uStack_8 + 4));
  }
  else {
    uStack_8 = CONCAT44(PGRP_LIST[(uint)p_grp].group,(int)in_RAX);
  }
  poVar1 = armci_group_comm((ARMCI_Group *)((long)&uStack_8 + 4));
  return poVar1;
}

Assistant:

MPI_Comm GA_MPI_Comm_pgroup(int p_grp)
{
    ARMCI_Group group;
    if (p_grp > 0) {
        group = PGRP_LIST[p_grp].group;
    }
    else {
        ARMCI_Group_get_world(&group);
    }
#   if HAVE_ARMCI_GROUP_COMM_MEMBER
    return group.comm;
#   else
    return armci_group_comm(&group);
#   endif
}